

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::mark_down(Omega_h *this,Graph *l2h,Read<signed_char> *high_marked)

{
  int size_in;
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Write<signed_char> local_f8;
  undefined1 local_e8 [8];
  type f;
  string local_a0 [32];
  undefined1 local_80 [8];
  Write<signed_char> low_marks_w;
  int nl;
  undefined1 local_60 [8];
  LOs lh2h;
  LOs l2lh;
  Read<signed_char> *high_marked_local;
  Graph *l2h_local;
  ulong local_10;
  
  Read<int>::Read((Read<int> *)&lh2h.write_.shared_alloc_.direct_ptr,&l2h->a2ab);
  Read<int>::Read((Read<int> *)local_60,&l2h->ab2b);
  if (((ulong)lh2h.write_.shared_alloc_.direct_ptr & 1) == 0) {
    local_10 = *lh2h.write_.shared_alloc_.direct_ptr;
  }
  else {
    local_10 = (ulong)lh2h.write_.shared_alloc_.direct_ptr >> 3;
  }
  size_in = (int)(local_10 >> 2) + -1;
  low_marks_w.shared_alloc_.direct_ptr._0_4_ = size_in;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a0,"",(allocator *)((long)&f.low_marks_w.shared_alloc_.direct_ptr + 7));
  Write<signed_char>::Write((Write<signed_char> *)local_80,size_in,'\0',(string *)local_a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&f.low_marks_w.shared_alloc_.direct_ptr + 7));
  Read<int>::Read((Read<int> *)local_e8,(Read<int> *)&lh2h.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read((Read<signed_char> *)&f.l2lh.write_.shared_alloc_.direct_ptr,high_marked);
  Read<int>::Read((Read<int> *)&f.high_marked.write_.shared_alloc_.direct_ptr,(Read<int> *)local_60)
  ;
  Write<signed_char>::Write
            ((Write<signed_char> *)&f.lh2h.write_.shared_alloc_.direct_ptr,
             (Write<signed_char> *)local_80);
  parallel_for<Omega_h::mark_down(Omega_h::Graph,Omega_h::Read<signed_char>)::__0>
            ((int)low_marks_w.shared_alloc_.direct_ptr,(type *)local_e8);
  Write<signed_char>::Write(&local_f8,(Write<signed_char> *)local_80);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_f8);
  Write<signed_char>::~Write(&local_f8);
  mark_down(Omega_h::Graph,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)local_e8);
  Write<signed_char>::~Write((Write<signed_char> *)local_80);
  Read<int>::~Read((Read<int> *)local_60);
  Read<int>::~Read((Read<int> *)&lh2h.write_.shared_alloc_.direct_ptr);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_down(Graph l2h, Read<I8> high_marked) {
  auto l2lh = l2h.a2ab;
  auto lh2h = l2h.ab2b;
  auto nl = l2lh.size() - 1;
  Write<I8> low_marks_w(nl, 0);
  auto f = OMEGA_H_LAMBDA(LO l) {
    for (LO lh = l2lh[l]; lh < l2lh[l + 1]; ++lh)
      if (high_marked[lh2h[lh]]) low_marks_w[l] = 1;
  };
  parallel_for(nl, std::move(f));
  return low_marks_w;
}